

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

nh_option_desc * clone_optlist(nh_option_desc *in)

{
  nh_option_desc *__dest;
  char *pcVar1;
  nh_autopickup_rules *pnVar2;
  nh_msgtype_rules *pnVar3;
  nh_option_desc *out;
  int i;
  nh_option_desc *in_local;
  
  out._4_4_ = 0;
  while (in[out._4_4_].name != (char *)0x0) {
    out._4_4_ = out._4_4_ + 1;
  }
  __dest = (nh_option_desc *)malloc((long)(out._4_4_ + 1) * 0x30);
  memcpy(__dest,in,(long)(out._4_4_ + 1) * 0x30);
  out._4_4_ = 0;
  while (in[out._4_4_].name != (char *)0x0) {
    if ((in[out._4_4_].type == OPTTYPE_STRING) && (in[out._4_4_].value.s != (char *)0x0)) {
      pcVar1 = strdup(in[out._4_4_].value.s);
      __dest[out._4_4_].value.s = pcVar1;
    }
    else if ((in[out._4_4_].type == OPTTYPE_AUTOPICKUP_RULES) &&
            (in[out._4_4_].value.s != (char *)0x0)) {
      pnVar2 = copy_autopickup_rules(in[out._4_4_].value.ar);
      __dest[out._4_4_].value.ar = pnVar2;
    }
    else if ((in[out._4_4_].type == OPTTYPE_MSGTYPE) && (in[out._4_4_].value.s != (char *)0x0)) {
      pnVar3 = copy_msgtype_rules(in[out._4_4_].value.mt);
      __dest[out._4_4_].value.mt = pnVar3;
    }
    out._4_4_ = out._4_4_ + 1;
  }
  return __dest;
}

Assistant:

struct nh_option_desc *clone_optlist(const struct nh_option_desc *in)
{
	int i;
	struct nh_option_desc *out;
	
	for (i = 0; in[i].name; i++)
	    ;
	i++;
	out = malloc(sizeof(struct nh_option_desc) * i);
	memcpy(out, in, sizeof(struct nh_option_desc) * i);
	
	for (i = 0; in[i].name; i++) {
	    if (in[i].type == OPTTYPE_STRING && in[i].value.s)
		out[i].value.s = strdup(in[i].value.s);
	    else if (in[i].type == OPTTYPE_AUTOPICKUP_RULES && in[i].value.ar)
		out[i].value.ar = copy_autopickup_rules(in[i].value.ar);
	    else if (in[i].type == OPTTYPE_MSGTYPE && in[i].value.mt)
		out[i].value.mt = copy_msgtype_rules(in[i].value.mt);
	}
	
	return out;
}